

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

size_t duckdb_je_xallocx(void *ptr,size_t size,size_t extra,int flags)

{
  ulong oldsize;
  uint64_t uVar1;
  bool bVar2;
  _Bool _Var3;
  uintptr_t uVar4;
  tsd_t *tsd;
  void *key;
  _Bool _Var5;
  ulong uVar7;
  uintptr_t new_usize;
  uintptr_t in_R8;
  rtree_t *prVar8;
  long *in_FS_OFFSET;
  rtree_metadata_t rVar9;
  size_t local_1d8;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_48;
  byte bVar6;
  
  _Var3 = duckdb_je_opt_zero;
  bVar6 = (byte)((flags & 0x40U) >> 6);
  _Var5 = (_Bool)(bVar6 | duckdb_je_opt_zero);
  tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  if ((*(char *)(*in_FS_OFFSET + -0x2758) == '\0') ||
     (tsd = duckdb_je_tsd_fetch_slow(tsd,false), tsd != (tsd_t *)0x0)) {
    prVar8 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    bVar2 = false;
  }
  else {
    prVar8 = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar8);
    bVar2 = true;
    tsd = (tsd_t *)0x0;
  }
  key = ptr;
  rtree_read(&local_48,(tsdn_t *)tsd,prVar8,(rtree_ctx_t *)ptr,in_R8);
  if (bVar2) {
    prVar8 = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar8);
  }
  else {
    prVar8 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rVar9 = rtree_metadata_read((tsdn_t *)tsd,prVar8,(rtree_ctx_t *)ptr,(uintptr_t)key);
  oldsize = duckdb_je_sz_index2size_tab[rVar9.szind];
  new_usize = oldsize;
  local_1d8 = extra;
  if (size < 0x7000000000000001) {
    uVar7 = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
    local_1d8 = extra;
    if (0x7000000000000000 - size < extra) {
      local_1d8 = 0x7000000000000000 - size;
    }
    if ((((uVar7 == 0) || ((uVar7 - 1 & (ulong)ptr) == 0)) &&
        (_Var5 = duckdb_je_arena_ralloc_no_move
                           ((tsdn_t *)tsd,ptr,oldsize,size,local_1d8,_Var5,
                            (size_t *)&rtree_ctx_fallback),
        uVar4 = rtree_ctx_fallback.cache[0].leafkey, !_Var5)) &&
       (rtree_ctx_fallback.cache[0].leafkey != oldsize)) {
      rtree_ctx_fallback.cache[0].leafkey = CONCAT71(rtree_ctx_fallback.cache[0].leafkey._1_7_,1);
      rtree_ctx_fallback.cache[0].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      rtree_ctx_fallback.cache[1].leafkey =
           (uintptr_t)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
      rtree_ctx_fallback.cache[1].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
      rtree_ctx_fallback.cache[2].leafkey =
           (uintptr_t)
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
      uVar1 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar1 + uVar4;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event -
          uVar1 <= uVar4) {
        duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
      }
      rtree_ctx_fallback.cache[0].leafkey = rtree_ctx_fallback.cache[0].leafkey & 0xffffffffffffff00
      ;
      rtree_ctx_fallback.cache[0].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      rtree_ctx_fallback.cache[1].leafkey =
           (uintptr_t)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event
      ;
      rtree_ctx_fallback.cache[1].leaf =
           (rtree_leaf_elm_t *)
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event
      ;
      rtree_ctx_fallback.cache[2].leafkey =
           (uintptr_t)
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
      ;
      uVar1 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated =
           uVar1 + oldsize;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
          uVar1 <= oldsize) {
        duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
      }
      new_usize = uVar4;
      if ((duckdb_je_opt_junk_alloc == true) &&
         ((oldsize <= uVar4 && uVar4 - oldsize != 0) && (bVar6 == 0 && !_Var3))) {
        switchD_004a0b15::default((void *)((long)ptr + oldsize),0xa5,uVar4 - oldsize);
      }
    }
  }
  if ((tsd->state).repr != '\0') {
    rtree_ctx_fallback.cache[1].leafkey = local_1d8;
    rtree_ctx_fallback.cache[1].leaf = (rtree_leaf_elm_t *)(long)flags;
    rtree_ctx_fallback.cache[0].leafkey = (uintptr_t)ptr;
    rtree_ctx_fallback.cache[0].leaf = (rtree_leaf_elm_t *)size;
    duckdb_je_hook_invoke_expand
              (hook_expand_xallocx,ptr,oldsize,new_usize,new_usize,(uintptr_t *)&rtree_ctx_fallback)
    ;
  }
  return new_usize;
}

Assistant:

JEMALLOC_NOTHROW
je_xallocx(void *ptr, size_t size, size_t extra, int flags) {
	tsd_t *tsd;
	size_t usize, old_usize;
	size_t alignment = MALLOCX_ALIGN_GET(flags);
	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	LOG("core.xallocx.entry", "ptr: %p, size: %zu, extra: %zu, "
	    "flags: %d", ptr, size, extra, flags);

	assert(ptr != NULL);
	assert(size != 0);
	assert(SIZE_T_MAX - size >= extra);
	assert(malloc_initialized() || IS_INITIALIZER);
	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	/*
	 * old_edata is only for verifying that xallocx() keeps the edata_t
	 * object associated with the ptr (though the content of the edata_t
	 * object can be changed).
	 */
	edata_t *old_edata = emap_edata_lookup(tsd_tsdn(tsd),
	    &arena_emap_global, ptr);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
	    &alloc_ctx);
	assert(alloc_ctx.szind != SC_NSIZES);
	old_usize = sz_index2size(alloc_ctx.szind);
	assert(old_usize == isalloc(tsd_tsdn(tsd), ptr));
	/*
	 * The API explicitly absolves itself of protecting against (size +
	 * extra) numerical overflow, but we may need to clamp extra to avoid
	 * exceeding SC_LARGE_MAXCLASS.
	 *
	 * Ordinarily, size limit checking is handled deeper down, but here we
	 * have to check as part of (size + extra) clamping, since we need the
	 * clamped value in the above helper functions.
	 */
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		usize = old_usize;
		goto label_not_resized;
	}
	if (unlikely(SC_LARGE_MAXCLASS - size < extra)) {
		extra = SC_LARGE_MAXCLASS - size;
	}

	if (config_prof && opt_prof) {
		usize = ixallocx_prof(tsd, ptr, old_usize, size, extra,
		    alignment, zero, &alloc_ctx);
	} else {
		usize = ixallocx_helper(tsd_tsdn(tsd), ptr, old_usize, size,
		    extra, alignment, zero);
	}

	/*
	 * xallocx() should keep using the same edata_t object (though its
	 * content can be changed).
	 */
	assert(emap_edata_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr)
	    == old_edata);

	if (unlikely(usize == old_usize)) {
		goto label_not_resized;
	}
	thread_alloc_event(tsd, usize);
	thread_dalloc_event(tsd, old_usize);

	if (config_fill && unlikely(opt_junk_alloc) && usize > old_usize &&
	    !zero) {
		size_t excess_len = usize - old_usize;
		void *excess_start = (void *)((byte_t *)ptr + old_usize);
		junk_alloc_callback(excess_start, excess_len);
	}
label_not_resized:
	if (unlikely(!tsd_fast(tsd))) {
		uintptr_t args[4] = {(uintptr_t)ptr, size, extra, flags};
		hook_invoke_expand(hook_expand_xallocx, ptr, old_usize,
		    usize, (uintptr_t)usize, args);
	}

	UTRACE(ptr, size, ptr);
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.xallocx.exit", "result: %zu", usize);
	return usize;
}